

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

Token * __thiscall inja::Lexer::scan(Token *__return_storage_ptr__,Lexer *this)

{
  string_view *this_00;
  char *pcVar1;
  LexerConfig *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> other;
  basic_string_view<char,_std::char_traits<char>_> other_00;
  basic_string_view<char,_std::char_traits<char>_> other_01;
  bool bVar3;
  int iVar4;
  State SVar5;
  ulong uVar6;
  size_type sVar7;
  size_type sVar8;
  char *pcVar9;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  Kind closeKind;
  char *in_R8;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  size_type sVar17;
  size_type pos;
  basic_string_view<char,_std::char_traits<char>_> bVar18;
  basic_string_view<char,_std::char_traits<char>_> bVar19;
  string_view sVar20;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  char *pcVar10;
  
  uVar6 = this->m_pos;
  this->m_tok_start = uVar6;
  if ((this->m_in).size_ <= uVar6) {
LAB_001a1beb:
    uVar13 = (this->m_in).size_;
    local_40 = this->m_in;
    if (uVar13 < uVar6) {
      uVar6 = uVar13;
    }
    uVar11 = this->m_pos;
    if (this->m_pos < uVar6) {
      uVar11 = uVar6;
    }
    if (uVar13 <= uVar11) {
      uVar11 = uVar13;
    }
LAB_001a1c18:
    sVar20 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_40,uVar6,uVar11 - uVar6);
    __return_storage_ptr__->kind = Eof;
LAB_001a1c26:
    __return_storage_ptr__->text = sVar20;
    return __return_storage_ptr__;
  }
  this_00 = &this->m_in;
LAB_001a19ff:
  switch(this->m_state) {
  case ExpressionStart:
    this->m_state = ExpressionBody;
    local_40.data_ = (this->m_in).data_;
    uVar13 = this->m_pos + (this->m_config->expression_open)._M_string_length;
    this->m_pos = uVar13;
    local_40.size_ = (this->m_in).size_;
    if (local_40.size_ < uVar6) {
      uVar6 = local_40.size_;
    }
    if (uVar13 < uVar6) {
      uVar13 = uVar6;
    }
    if (local_40.size_ <= uVar13) {
      uVar13 = local_40.size_;
    }
    sVar20 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_40,uVar6,uVar13 - uVar6);
    __return_storage_ptr__->kind = ExpressionOpen;
    goto LAB_001a1c26;
  case ExpressionBody:
    pcVar12 = (this->m_config->expression_close)._M_dataplus._M_p;
    sVar8 = (this->m_config->expression_close)._M_string_length;
    closeKind = ExpressionClose;
    break;
  case LineStart:
    this->m_state = LineBody;
    local_40.data_ = (this->m_in).data_;
    uVar13 = this->m_pos + (this->m_config->line_statement)._M_string_length;
    this->m_pos = uVar13;
    local_40.size_ = (this->m_in).size_;
    if (local_40.size_ < uVar6) {
      uVar6 = local_40.size_;
    }
    if (uVar13 < uVar6) {
      uVar13 = uVar6;
    }
    if (local_40.size_ <= uVar13) {
      uVar13 = local_40.size_;
    }
    sVar20 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_40,uVar6,uVar13 - uVar6);
    __return_storage_ptr__->kind = LineStatementOpen;
    goto LAB_001a1c26;
  case LineBody:
    pcVar12 = "\n";
    sVar8 = 1;
    closeKind = LineStatementClose;
    break;
  case StatementStart:
    this->m_state = StatementBody;
    local_40.data_ = (this->m_in).data_;
    uVar13 = this->m_pos + (this->m_config->statement_open)._M_string_length;
    this->m_pos = uVar13;
    local_40.size_ = (this->m_in).size_;
    if (local_40.size_ < uVar6) {
      uVar6 = local_40.size_;
    }
    if (uVar13 < uVar6) {
      uVar13 = uVar6;
    }
    if (local_40.size_ <= uVar13) {
      uVar13 = local_40.size_;
    }
    sVar20 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_40,uVar6,uVar13 - uVar6);
    __return_storage_ptr__->kind = StatementOpen;
    goto LAB_001a1c26;
  case StatementBody:
    pcVar12 = (this->m_config->statement_close)._M_dataplus._M_p;
    sVar8 = (this->m_config->statement_close)._M_string_length;
    closeKind = StatementClose;
    break;
  case CommentStart:
    this->m_state = CommentBody;
    local_40.data_ = (this->m_in).data_;
    uVar13 = this->m_pos + (this->m_config->comment_open)._M_string_length;
    this->m_pos = uVar13;
    local_40.size_ = (this->m_in).size_;
    if (local_40.size_ < uVar6) {
      uVar6 = local_40.size_;
    }
    if (uVar13 < uVar6) {
      uVar13 = uVar6;
    }
    if (local_40.size_ <= uVar13) {
      uVar13 = local_40.size_;
    }
    sVar20 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_40,uVar6,uVar13 - uVar6);
    __return_storage_ptr__->kind = CommentOpen;
    goto LAB_001a1c26;
  case CommentBody:
    local_40 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (this_00,this->m_pos,0xffffffffffffffff);
    bVar19.data_ = (this->m_config->comment_close)._M_dataplus._M_p;
    bVar19.size_ = (this->m_config->comment_close)._M_string_length;
    sVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
                      (&local_40,bVar19,0);
    if (sVar7 == 0xffffffffffffffff) {
      uVar11 = (this->m_in).size_;
      local_40 = this->m_in;
      this->m_pos = uVar11;
      uVar6 = this->m_tok_start;
      if (uVar11 < this->m_tok_start) {
        uVar6 = uVar11;
      }
      goto LAB_001a1c18;
    }
    this->m_state = Text;
    local_40.data_ = (this->m_in).data_;
    uVar6 = sVar7 + (this->m_config->comment_close)._M_string_length + this->m_pos;
    this->m_pos = uVar6;
    local_40.size_ = (this->m_in).size_;
    uVar13 = this->m_tok_start;
    if (local_40.size_ < this->m_tok_start) {
      uVar13 = local_40.size_;
    }
    if (uVar6 < uVar13) {
      uVar6 = uVar13;
    }
    if (local_40.size_ <= uVar6) {
      uVar6 = local_40.size_;
    }
    sVar20 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_40,uVar13,uVar6 - uVar13);
    __return_storage_ptr__->kind = CommentClose;
    goto LAB_001a1c26;
  default:
    lVar16 = -1;
    bVar18 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (this_00,this->m_pos,0xffffffffffffffff);
    pcVar12 = bVar18.data_;
    if (bVar18.size_ != 0) {
      pcVar10 = (this->m_config->open_chars)._M_dataplus._M_p;
      sVar8 = (this->m_config->open_chars)._M_string_length;
      pcVar9 = pcVar12 + bVar18.size_;
      pcVar14 = in_R8;
      pcVar15 = pcVar12;
      do {
        bVar3 = sVar8 == 0;
        if (sVar8 != 0) {
          if (*pcVar15 != *pcVar10) {
            sVar17 = 1;
            do {
              bVar3 = sVar8 == sVar17;
              if (sVar8 == sVar17) goto LAB_001a1a7f;
              pcVar1 = pcVar10 + sVar17;
              sVar17 = sVar17 + 1;
            } while (*pcVar15 != *pcVar1);
          }
          pcVar14 = pcVar15;
          bVar3 = false;
        }
LAB_001a1a7f:
        in_R8 = pcVar14;
      } while ((bVar3) && (pcVar15 = pcVar15 + 1, in_R8 = pcVar9, pcVar15 != pcVar9));
      lVar16 = (long)in_R8 - (long)pcVar12;
      if (pcVar9 == in_R8) {
        lVar16 = -1;
      }
    }
    if (lVar16 == -1) {
      uVar13 = (this->m_in).size_;
      local_40 = this->m_in;
      this->m_pos = uVar13;
      uVar6 = this->m_tok_start;
      if (uVar13 < this->m_tok_start) {
        uVar6 = uVar13;
      }
LAB_001a1ee8:
      sVar20 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_40,uVar6,uVar13 - uVar6);
      __return_storage_ptr__->kind = Text;
      goto LAB_001a1c26;
    }
    pos = lVar16 + this->m_pos;
    this->m_pos = pos;
    bVar19 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                       (this_00,pos,0xffffffffffffffff);
    pcVar10 = (char *)bVar19.size_;
    pLVar2 = this->m_config;
    pcVar12 = (char *)(pLVar2->expression_open)._M_string_length;
    bVar18.data_ = (pLVar2->expression_open)._M_dataplus._M_p;
    bVar18.size_ = (pLVar2->expression_open)._M_string_length;
    if ((pcVar10 < pcVar12) ||
       (local_40 = bVar19,
       iVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
                         (&local_40,0,(size_type)pcVar12,bVar18), in_R8 = pcVar12, iVar4 != 0)) {
      pLVar2 = this->m_config;
      pcVar12 = (char *)(pLVar2->statement_open)._M_string_length;
      other.data_ = (pLVar2->statement_open)._M_dataplus._M_p;
      other.size_ = (pLVar2->statement_open)._M_string_length;
      if ((pcVar12 <= pcVar10) &&
         (local_40 = bVar19,
         iVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
                           (&local_40,0,(size_type)pcVar12,other), in_R8 = pcVar12, iVar4 == 0)) {
        SVar5 = StatementStart;
        goto LAB_001a1bc9;
      }
      pLVar2 = this->m_config;
      pcVar12 = (char *)(pLVar2->comment_open)._M_string_length;
      other_00.data_ = (pLVar2->comment_open)._M_dataplus._M_p;
      other_00.size_ = (pLVar2->comment_open)._M_string_length;
      local_40 = bVar19;
      if ((pcVar12 <= pcVar10) &&
         (iVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&local_40,0,(size_type)pcVar12,other_00), in_R8 = pcVar12, iVar4 == 0))
      {
        SVar5 = CommentStart;
        goto LAB_001a1bc9;
      }
      if (this->m_pos == 0) {
LAB_001a1b7d:
        pLVar2 = this->m_config;
        pcVar12 = (char *)(pLVar2->line_statement)._M_string_length;
        other_01.data_ = (pLVar2->line_statement)._M_dataplus._M_p;
        other_01.size_ = (pLVar2->line_statement)._M_string_length;
        local_40 = bVar19;
        if ((pcVar12 <= pcVar10) &&
           (iVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
                              (&local_40,0,(size_type)pcVar12,other_01), in_R8 = pcVar12, iVar4 == 0
           )) {
          SVar5 = LineStart;
          goto LAB_001a1bc9;
        }
      }
      else {
        uVar6 = this->m_pos - 1;
        if ((this->m_in).size_ <= uVar6) {
          __assert_fail("pos < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/inja.hpp"
                        ,0x340,
                        "const_reference nonstd::sv_lite::basic_string_view<char>::data_at(size_type) const [CharT = char, Traits = std::char_traits<char>]"
                       );
        }
        if (this_00->data_[uVar6] == '\n') goto LAB_001a1b7d;
      }
      this->m_pos = this->m_pos + 1;
      pcVar12 = in_R8;
    }
    else {
      SVar5 = ExpressionStart;
LAB_001a1bc9:
      this->m_state = SVar5;
      uVar6 = this->m_tok_start;
      uVar13 = this->m_pos;
      if (uVar13 != uVar6) {
        uVar11 = (this->m_in).size_;
        local_40 = this->m_in;
        if (uVar11 < uVar6) {
          uVar6 = uVar11;
        }
        if (uVar13 < uVar6) {
          uVar13 = uVar6;
        }
        if (uVar11 <= uVar13) {
          uVar13 = uVar11;
        }
        goto LAB_001a1ee8;
      }
    }
    uVar6 = this->m_tok_start;
    in_R8 = pcVar12;
    if ((this->m_in).size_ <= uVar6) goto LAB_001a1beb;
    goto LAB_001a19ff;
  }
  sVar20.size_ = sVar8;
  sVar20.data_ = pcVar12;
  scan_body(__return_storage_ptr__,this,sVar20,closeKind);
  return __return_storage_ptr__;
}

Assistant:

Token scan() {
		m_tok_start = m_pos;

	again:
		if (m_tok_start >= m_in.size()) return make_token(Token::Kind::Eof);

		switch (m_state) {
			default:
			case State::Text: {
				// fast-scan to first open character
				size_t open_start = m_in.substr(m_pos).find_first_of(m_config.open_chars);
				if (open_start == nonstd::string_view::npos) {
					// didn't find open, return remaining text as text token
					m_pos = m_in.size();
					return make_token(Token::Kind::Text);
				}
				m_pos += open_start;

				// try to match one of the opening sequences, and get the close
				nonstd::string_view open_str = m_in.substr(m_pos);
				if (inja::string_view::starts_with(open_str, m_config.expression_open)) {
					m_state = State::ExpressionStart;
				} else if (inja::string_view::starts_with(open_str, m_config.statement_open)) {
					m_state = State::StatementStart;
				} else if (inja::string_view::starts_with(open_str, m_config.comment_open)) {
					m_state = State::CommentStart;
				} else if ((m_pos == 0 || m_in[m_pos - 1] == '\n') &&
						   inja::string_view::starts_with(open_str, m_config.line_statement)) {
					m_state = State::LineStart;
				} else {
					m_pos += 1;  // wasn't actually an opening sequence
					goto again;
				}
				if (m_pos == m_tok_start) goto again;  // don't generate empty token
				return make_token(Token::Kind::Text);
			}
			case State::ExpressionStart: {
				m_state = State::ExpressionBody;
				m_pos += m_config.expression_open.size();
				return make_token(Token::Kind::ExpressionOpen);
			}
			case State::LineStart: {
				m_state = State::LineBody;
				m_pos += m_config.line_statement.size();
				return make_token(Token::Kind::LineStatementOpen);
			}
			case State::StatementStart: {
				m_state = State::StatementBody;
				m_pos += m_config.statement_open.size();
				return make_token(Token::Kind::StatementOpen);
			}
			case State::CommentStart: {
				m_state = State::CommentBody;
				m_pos += m_config.comment_open.size();
				return make_token(Token::Kind::CommentOpen);
			}
			case State::ExpressionBody:
				return scan_body(m_config.expression_close, Token::Kind::ExpressionClose);
			case State::LineBody:
				return scan_body("\n", Token::Kind::LineStatementClose);
			case State::StatementBody:
				return scan_body(m_config.statement_close, Token::Kind::StatementClose);
			case State::CommentBody: {
				// fast-scan to comment close
				size_t end = m_in.substr(m_pos).find(m_config.comment_close);
				if (end == nonstd::string_view::npos) {
					m_pos = m_in.size();
					return make_token(Token::Kind::Eof);
				}
				// return the entire comment in the close token
				m_state = State::Text;
				m_pos += end + m_config.comment_close.size();
				return make_token(Token::Kind::CommentClose);
			}
		}
	}